

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cc
# Opt level: O1

string * __thiscall muduo::Date::toIsoString_abi_cxx11_(string *__return_storage_ptr__,Date *this)

{
  size_t sVar1;
  YearMonthDay YVar2;
  char buf [32];
  char acStack_38 [40];
  
  YVar2 = detail::getYearMonthDay(this->julianDayNumber_);
  snprintf(acStack_38,0x20,"%4d-%02d-%02d",(ulong)(uint)YVar2.year,YVar2._0_8_ >> 0x20,
           (ulong)(uint)YVar2.day);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_38);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_38,acStack_38 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

string Date::toIsoString() const
{
  char buf[32];
  YearMonthDay ymd(yearMonthDay());
  snprintf(buf, sizeof buf, "%4d-%02d-%02d", ymd.year, ymd.month, ymd.day);
  return buf;
}